

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O1

int mbedtls_ccm_crypt(mbedtls_ccm_context *ctx,size_t offset,size_t use_len,uchar *input,
                     uchar *output)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t local_50;
  size_t olen;
  uchar tmp_buf [16];
  
  local_50 = 0;
  olen = 0;
  tmp_buf[0] = '\0';
  tmp_buf[1] = '\0';
  tmp_buf[2] = '\0';
  tmp_buf[3] = '\0';
  tmp_buf[4] = '\0';
  tmp_buf[5] = '\0';
  tmp_buf[6] = '\0';
  tmp_buf[7] = '\0';
  tmp_buf._8_8_ = offset;
  iVar1 = mbedtls_cipher_update(&ctx->cipher_ctx,ctx->ctr,0x10,(uchar *)&olen,&local_50);
  if (iVar1 == 0) {
    if (use_len < 8) {
      uVar2 = 0;
    }
    else {
      uVar3 = 0;
      do {
        *(ulong *)(output + uVar3) =
             *(ulong *)(tmp_buf + uVar3 + tmp_buf._8_8_ + -8) ^ *(ulong *)(input + uVar3);
        uVar2 = uVar3 + 8;
        uVar4 = uVar3 + 0x10;
        uVar3 = uVar2;
      } while (uVar4 <= use_len);
    }
    if (uVar2 < use_len) {
      do {
        output[uVar2] = tmp_buf[uVar2 + tmp_buf._8_8_ + -8] ^ input[uVar2];
        uVar2 = uVar2 + 1;
      } while (use_len != uVar2);
    }
  }
  else {
    *(byte *)&ctx->state = (byte)ctx->state | 0x10;
  }
  mbedtls_platform_zeroize(&olen,0x10);
  return iVar1;
}

Assistant:

static int mbedtls_ccm_crypt(mbedtls_ccm_context *ctx,
                             size_t offset, size_t use_len,
                             const unsigned char *input,
                             unsigned char *output)
{
    size_t olen = 0;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char tmp_buf[16] = { 0 };

    if ((ret = mbedtls_cipher_update(&ctx->cipher_ctx, ctx->ctr, 16, tmp_buf,
                                     &olen)) != 0) {
        ctx->state |= CCM_STATE__ERROR;
        mbedtls_platform_zeroize(tmp_buf, sizeof(tmp_buf));
        return ret;
    }

    mbedtls_xor(output, input, tmp_buf + offset, use_len);

    mbedtls_platform_zeroize(tmp_buf, sizeof(tmp_buf));
    return ret;
}